

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O3

ON_Quaternion * __thiscall
ON_Quaternion::operator*(ON_Quaternion *__return_storage_ptr__,ON_Quaternion *this,ON_Quaternion *q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar1 = this->a;
  dVar2 = this->b;
  dVar3 = q->a;
  dVar4 = q->b;
  dVar5 = this->c;
  dVar6 = this->d;
  dVar7 = q->c;
  dVar8 = q->d;
  ON_Quaternion(__return_storage_ptr__,
                ((dVar1 * dVar3 - dVar4 * dVar2) - dVar5 * dVar7) - dVar6 * dVar8,
                (dVar5 * dVar8 + dVar1 * dVar4 + dVar3 * dVar2) - dVar6 * dVar7,
                dVar6 * dVar4 + dVar5 * dVar3 + (dVar1 * dVar7 - dVar8 * dVar2),
                dVar6 * dVar3 + ((dVar1 * dVar8 + dVar2 * dVar7) - dVar5 * dVar4));
  return __return_storage_ptr__;
}

Assistant:

ON_Quaternion  ON_Quaternion::operator*(const ON_Quaternion& q) const
{
  return ON_Quaternion(a*q.a - b*q.b - c*q.c - d*q.d,
                       a*q.b + b*q.a + c*q.d - d*q.c,
                       a*q.c - b*q.d + c*q.a + d*q.b,
                       a*q.d + b*q.c - c*q.b + d*q.a);
}